

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picnic3_impl.c
# Opt level: O3

void expandChallenge(uint16_t *challengeC,uint16_t *challengeP,uint8_t *sigH,
                    picnic_instance_t *params)

{
  byte bVar1;
  byte bVar2;
  ushort uVar3;
  size_t sVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  bool bVar11;
  uint8_t h [64];
  uint16_t chunks [128];
  hash_context ctx;
  BitSequence local_271;
  ulong local_270;
  uint local_264;
  size_t local_260;
  uint8_t local_258 [64];
  uint16_t local_218 [132];
  Keccak_HashInstance local_110;
  
  local_258[0] = '\0';
  local_258[1] = '\0';
  local_258[2] = '\0';
  local_258[3] = '\0';
  local_258[4] = '\0';
  local_258[5] = '\0';
  local_258[6] = '\0';
  local_258[7] = '\0';
  local_258[8] = '\0';
  local_258[9] = '\0';
  local_258[10] = '\0';
  local_258[0xb] = '\0';
  local_258[0xc] = '\0';
  local_258[0xd] = '\0';
  local_258[0xe] = '\0';
  local_258[0xf] = '\0';
  local_258[0x10] = '\0';
  local_258[0x11] = '\0';
  local_258[0x12] = '\0';
  local_258[0x13] = '\0';
  local_258[0x14] = '\0';
  local_258[0x15] = '\0';
  local_258[0x16] = '\0';
  local_258[0x17] = '\0';
  local_258[0x18] = '\0';
  local_258[0x19] = '\0';
  local_258[0x1a] = '\0';
  local_258[0x1b] = '\0';
  local_258[0x1c] = '\0';
  local_258[0x1d] = '\0';
  local_258[0x1e] = '\0';
  local_258[0x1f] = '\0';
  local_258[0x20] = '\0';
  local_258[0x21] = '\0';
  local_258[0x22] = '\0';
  local_258[0x23] = '\0';
  local_258[0x24] = '\0';
  local_258[0x25] = '\0';
  local_258[0x26] = '\0';
  local_258[0x27] = '\0';
  local_258[0x28] = '\0';
  local_258[0x29] = '\0';
  local_258[0x2a] = '\0';
  local_258[0x2b] = '\0';
  local_258[0x2c] = '\0';
  local_258[0x2d] = '\0';
  local_258[0x2e] = '\0';
  local_258[0x2f] = '\0';
  local_258[0x30] = '\0';
  local_258[0x31] = '\0';
  local_258[0x32] = '\0';
  local_258[0x33] = '\0';
  local_258[0x34] = '\0';
  local_258[0x35] = '\0';
  local_258[0x36] = '\0';
  local_258[0x37] = '\0';
  local_258[0x38] = '\0';
  local_258[0x39] = '\0';
  local_258[0x3a] = '\0';
  local_258[0x3b] = '\0';
  local_258[0x3c] = '\0';
  local_258[0x3d] = '\0';
  local_258[0x3e] = '\0';
  local_258[0x3f] = '\0';
  memcpy(local_258,sigH,(ulong)params->digest_size);
  local_218[0x60] = 0;
  local_218[0x61] = 0;
  local_218[0x62] = 0;
  local_218[99] = 0;
  local_218[100] = 0;
  local_218[0x65] = 0;
  local_218[0x66] = 0;
  local_218[0x67] = 0;
  local_218[0x68] = 0;
  local_218[0x69] = 0;
  local_218[0x6a] = 0;
  local_218[0x6b] = 0;
  local_218[0x6c] = 0;
  local_218[0x6d] = 0;
  local_218[0x6e] = 0;
  local_218[0x6f] = 0;
  local_218[0x70] = 0;
  local_218[0x71] = 0;
  local_218[0x72] = 0;
  local_218[0x73] = 0;
  local_218[0x74] = 0;
  local_218[0x75] = 0;
  local_218[0x76] = 0;
  local_218[0x77] = 0;
  local_218[0x78] = 0;
  local_218[0x79] = 0;
  local_218[0x7a] = 0;
  local_218[0x7b] = 0;
  local_218[0x7c] = 0;
  local_218[0x7d] = 0;
  local_218[0x7e] = 0;
  local_218[0x7f] = 0;
  local_218[0x40] = 0;
  local_218[0x41] = 0;
  local_218[0x42] = 0;
  local_218[0x43] = 0;
  local_218[0x44] = 0;
  local_218[0x45] = 0;
  local_218[0x46] = 0;
  local_218[0x47] = 0;
  local_218[0x48] = 0;
  local_218[0x49] = 0;
  local_218[0x4a] = 0;
  local_218[0x4b] = 0;
  local_218[0x4c] = 0;
  local_218[0x4d] = 0;
  local_218[0x4e] = 0;
  local_218[0x4f] = 0;
  local_218[0x50] = 0;
  local_218[0x51] = 0;
  local_218[0x52] = 0;
  local_218[0x53] = 0;
  local_218[0x54] = 0;
  local_218[0x55] = 0;
  local_218[0x56] = 0;
  local_218[0x57] = 0;
  local_218[0x58] = 0;
  local_218[0x59] = 0;
  local_218[0x5a] = 0;
  local_218[0x5b] = 0;
  local_218[0x5c] = 0;
  local_218[0x5d] = 0;
  local_218[0x5e] = 0;
  local_218[0x5f] = 0;
  local_218[0x20] = 0;
  local_218[0x21] = 0;
  local_218[0x22] = 0;
  local_218[0x23] = 0;
  local_218[0x24] = 0;
  local_218[0x25] = 0;
  local_218[0x26] = 0;
  local_218[0x27] = 0;
  local_218[0x28] = 0;
  local_218[0x29] = 0;
  local_218[0x2a] = 0;
  local_218[0x2b] = 0;
  local_218[0x2c] = 0;
  local_218[0x2d] = 0;
  local_218[0x2e] = 0;
  local_218[0x2f] = 0;
  local_218[0x30] = 0;
  local_218[0x31] = 0;
  local_218[0x32] = 0;
  local_218[0x33] = 0;
  local_218[0x34] = 0;
  local_218[0x35] = 0;
  local_218[0x36] = 0;
  local_218[0x37] = 0;
  local_218[0x38] = 0;
  local_218[0x39] = 0;
  local_218[0x3a] = 0;
  local_218[0x3b] = 0;
  local_218[0x3c] = 0;
  local_218[0x3d] = 0;
  local_218[0x3e] = 0;
  local_218[0x3f] = 0;
  local_218[0] = 0;
  local_218[1] = 0;
  local_218[2] = 0;
  local_218[3] = 0;
  local_218[4] = 0;
  local_218[5] = 0;
  local_218[6] = 0;
  local_218[7] = 0;
  local_218[8] = 0;
  local_218[9] = 0;
  local_218[10] = 0;
  local_218[0xb] = 0;
  local_218[0xc] = 0;
  local_218[0xd] = 0;
  local_218[0xe] = 0;
  local_218[0xf] = 0;
  local_218[0x10] = 0;
  local_218[0x11] = 0;
  local_218[0x12] = 0;
  local_218[0x13] = 0;
  local_218[0x14] = 0;
  local_218[0x15] = 0;
  local_218[0x16] = 0;
  local_218[0x17] = 0;
  local_218[0x18] = 0;
  local_218[0x19] = 0;
  local_218[0x1a] = 0;
  local_218[0x1b] = 0;
  local_218[0x1c] = 0;
  local_218[0x1d] = 0;
  local_218[0x1e] = 0;
  local_218[0x1f] = 0;
  uVar7 = (ulong)params->num_opened_rounds;
  if (uVar7 != 0) {
    local_264 = (uint)params->num_MPC_parties;
    uVar10 = 0;
    local_270 = (ulong)(0x20 - LZCOUNT(local_264 - 1));
    local_260 = (ulong)(0x20 - LZCOUNT(params->num_rounds - 1));
    if (params->num_rounds == 0) {
      local_260 = uVar10;
    }
    do {
      bVar1 = params->digest_size;
      sVar4 = bitsToChunks(local_260,local_258,(ulong)bVar1,local_218);
      if (sVar4 != 0) {
        uVar5 = 0;
        do {
          uVar3 = local_218[uVar5];
          if (uVar3 < params->num_rounds) {
            if (uVar10 == 0) {
              *challengeC = uVar3;
              uVar10 = 1;
            }
            else {
              uVar9 = 0;
              do {
                if (challengeC[uVar9] == uVar3) goto LAB_0011d4e3;
                uVar9 = uVar9 + 1;
              } while (uVar10 != uVar9);
              challengeC[uVar10] = uVar3;
              uVar10 = uVar10 + 1;
            }
          }
LAB_0011d4e3:
        } while ((uVar10 != uVar7) && (uVar5 = uVar5 + 1, uVar5 < sVar4));
      }
      local_271 = '\x01';
      if (bVar1 == 0x20) {
        uVar8 = 0x540;
        uVar6 = 0x100;
      }
      else {
        uVar8 = 0x440;
        uVar6 = 0x200;
      }
      Keccak_HashInitialize(&local_110,uVar8,uVar6,0,'\x1f');
      Keccak_HashUpdate(&local_110,&local_271,8);
      Keccak_HashUpdate(&local_110,local_258,(ulong)params->digest_size << 3);
      Keccak_HashFinal(&local_110,(BitSequence *)0x0);
      Keccak_HashSqueeze(&local_110,local_258,(ulong)params->digest_size << 3);
      uVar7 = (ulong)params->num_opened_rounds;
    } while (uVar10 < uVar7);
    if (uVar7 != 0) {
      uVar10 = 0;
      if ((char)local_264 == '\0') {
        local_270 = uVar10;
      }
      do {
        bVar1 = params->digest_size;
        sVar4 = bitsToChunks(local_270,local_258,(ulong)bVar1,local_218);
        if (sVar4 != 0) {
          bVar2 = params->num_MPC_parties;
          uVar5 = 1;
          do {
            if (local_218[uVar5 - 1] < (ushort)bVar2) {
              challengeP[uVar10] = local_218[uVar5 - 1];
              uVar10 = uVar10 + 1;
            }
          } while ((uVar10 != uVar7) && (bVar11 = uVar5 < sVar4, uVar5 = uVar5 + 1, bVar11));
        }
        local_271 = '\x01';
        if (bVar1 == 0x20) {
          uVar8 = 0x540;
          uVar6 = 0x100;
        }
        else {
          uVar8 = 0x440;
          uVar6 = 0x200;
        }
        Keccak_HashInitialize(&local_110,uVar8,uVar6,0,'\x1f');
        Keccak_HashUpdate(&local_110,&local_271,8);
        Keccak_HashUpdate(&local_110,local_258,(ulong)params->digest_size << 3);
        Keccak_HashFinal(&local_110,(BitSequence *)0x0);
        Keccak_HashSqueeze(&local_110,local_258,(ulong)params->digest_size << 3);
        uVar7 = (ulong)params->num_opened_rounds;
      } while (uVar10 < uVar7);
    }
  }
  return;
}

Assistant:

static void expandChallenge(uint16_t* challengeC, uint16_t* challengeP, const uint8_t* sigH,
                            const picnic_instance_t* params) {
  uint8_t h[MAX_DIGEST_SIZE] = {0};
  hash_context ctx;

  memcpy(h, sigH, params->digest_size);
  // Populate C
  uint32_t bitsPerChunkC = ceil_log2(params->num_rounds);
  uint32_t bitsPerChunkP = ceil_log2(params->num_MPC_parties);
  assert(bitsPerChunkC >= 4);
  assert(bitsPerChunkP >= 4);
  // chunks would only require digest_size * 8 / min(bitsPerChunkC, bitsPerChunkP), but
  // bitsPerChunkP is always 4 and the minimum.
  uint16_t chunks[MAX_DIGEST_SIZE * 8 / 4] = {0};

  size_t countC = 0;
  while (countC < params->num_opened_rounds) {
    size_t numChunks = bitsToChunks(bitsPerChunkC, h, params->digest_size, chunks);
    for (size_t i = 0; i < numChunks; i++) {
      if (chunks[i] < params->num_rounds) {
        countC = appendUnique(challengeC, chunks[i], countC);
      }
      if (countC == params->num_opened_rounds) {
        break;
      }
    }

    hash_init_prefix(&ctx, params->digest_size, HASH_PREFIX_1);
    hash_update(&ctx, h, params->digest_size);
    hash_final(&ctx);
    hash_squeeze(&ctx, h, params->digest_size);
    hash_clear(&ctx);
  }

  // Note that we always compute h = H(h) after setting C
  size_t countP = 0;

  while (countP < params->num_opened_rounds) {
    size_t numChunks = bitsToChunks(bitsPerChunkP, h, params->digest_size, chunks);
    for (size_t i = 0; i < numChunks; i++) {
      if (chunks[i] < params->num_MPC_parties) {
        challengeP[countP] = chunks[i];
        countP++;
      }
      if (countP == params->num_opened_rounds) {
        break;
      }
    }

    hash_init_prefix(&ctx, params->digest_size, HASH_PREFIX_1);
    hash_update(&ctx, h, params->digest_size);
    hash_final(&ctx);
    hash_squeeze(&ctx, h, params->digest_size);
    hash_clear(&ctx);
  }
}